

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

void ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore_t *rawSeqStore,size_t nbBytes)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (int)nbBytes + (int)rawSeqStore->posInSequence;
  if (uVar3 != 0) {
    uVar1 = rawSeqStore->pos;
    lVar2 = uVar1 * 0xc + 8;
    do {
      if (rawSeqStore->size <= uVar1) {
LAB_00209783:
        if (rawSeqStore->size != uVar1) {
          return;
        }
        break;
      }
      uVar4 = *(int *)((long)&rawSeqStore->seq->offset + lVar2) +
              *(int *)((long)rawSeqStore->seq + lVar2 + -4);
      if (uVar3 < uVar4) {
        rawSeqStore->posInSequence = (ulong)uVar3;
        goto LAB_00209783;
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0xc;
      rawSeqStore->pos = uVar1;
      uVar3 = uVar3 - uVar4;
    } while (uVar3 != 0);
  }
  rawSeqStore->posInSequence = 0;
  return;
}

Assistant:

void ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes) {
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}